

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

void __thiscall
embree::ImageT<embree::Col3<unsigned_char>_>::set
          (ImageT<embree::Col3<unsigned_char>_> *this,size_t x,size_t y,Color4 *c)

{
  Col3<unsigned_char> *pCVar1;
  long lVar2;
  undefined1 auVar3 [16];
  
  lVar2 = y * (this->super_Image).width;
  pCVar1 = this->data;
  auVar3 = minps((undefined1  [16])c->field_0,_DAT_00243210);
  auVar3 = maxps(auVar3,ZEXT816(0));
  pCVar1[lVar2 + x].r = (uchar)(int)(auVar3._0_4_ * 255.0);
  pCVar1[lVar2 + x].g = (uchar)(int)(auVar3._4_4_ * 255.0);
  pCVar1[lVar2 + x].b = (uchar)(int)(auVar3._8_4_ * 255.0);
  return;
}

Assistant:

__forceinline void set(size_t x, size_t y, const Color4& c) { 
      c.set(data[y*width+x]); 
    }